

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_loop_expand.cpp
# Opt level: O2

void optimization::loop_expand::expand_loop(MirFunction *func,BasicBlk *blk,loop_info *info)

{
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *this;
  int *__k;
  int *__x;
  int iVar1;
  ostream *poVar2;
  Tag *pTVar3;
  long lVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  size_type sVar7;
  __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
  _Var8;
  pointer puVar9;
  loop_info *tag;
  Function *pFVar10;
  Tag *pTVar11;
  PhiInst *this_00;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *__args;
  VarId new_change_var;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  insts;
  Rewriter rwt;
  allocator<char> local_27b;
  allocator<char> local_27a;
  allocator<char> local_279;
  mapped_type *local_278;
  MirFunction *local_270;
  undefined1 local_268 [40];
  string local_240;
  key_type *local_220;
  undefined1 local_218 [48];
  undefined1 local_1e8 [40];
  int local_1c0;
  undefined8 local_1bc;
  undefined **local_190;
  undefined8 local_188;
  undefined1 local_180;
  undefined1 local_178 [24];
  _Rb_tree_node_base local_160;
  undefined1 local_140 [16];
  uint32_t local_130;
  undefined **local_128;
  Op local_120;
  undefined **local_118;
  uint32_t local_110;
  int local_108;
  VarId local_100;
  VarId local_f0;
  VarId local_e0;
  Value local_d0;
  undefined1 local_b0 [16];
  uint32_t local_a0;
  undefined1 local_98;
  undefined2 local_97;
  Value local_90;
  undefined1 local_70 [16];
  uint32_t local_60;
  undefined1 local_58;
  undefined2 local_57;
  Value local_50;
  
  local_268._32_8_ = &func->basic_blks;
  tag = info;
  local_278 = std::
              map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                    *)local_268._32_8_,&info->loop_start);
  local_190 = (undefined **)((ulong)local_190 & 0xffffffffffffff00);
  AixLog::operator<<((ostream *)&local_190,(Severity *)tag);
  AixLog::Tag::Tag((Tag *)local_1e8);
  AixLog::operator<<((ostream *)local_1e8,(Tag *)tag);
  local_240._M_string_length = std::chrono::_V2::system_clock::now();
  local_240._M_dataplus._M_p = (pointer)&PTR__Timestamp_001d8f28;
  local_240.field_2._M_local_buf[0] = '\0';
  AixLog::operator<<((ostream *)(local_268 + 0x28),(Timestamp *)tag);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_218,"expand_loop",&local_27a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_268,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
             ,&local_27b);
  pFVar10 = (Function *)local_218;
  AixLog::Function::Function((Function *)local_178,(string *)pFVar10,(string *)local_268,0x148);
  AixLog::operator<<((ostream *)local_178,pFVar10);
  poVar2 = std::operator<<((ostream *)&std::clog,"expand loop starts at  ");
  pTVar11 = (Tag *)(ulong)(uint)info->loop_start;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,info->loop_start);
  std::endl<char,std::char_traits<char>>(poVar2);
  AixLog::Function::~Function((Function *)local_178);
  std::__cxx11::string::~string((string *)local_268);
  std::__cxx11::string::~string((string *)local_218);
  AixLog::Tag::~Tag((Tag *)local_1e8);
  local_27a = (allocator<char>)0x0;
  AixLog::operator<<((ostream *)&local_27a,(Severity *)pTVar11);
  AixLog::Tag::Tag((Tag *)local_218);
  AixLog::operator<<((ostream *)local_218,pTVar11);
  local_188 = std::chrono::_V2::system_clock::now();
  local_190 = &PTR__Timestamp_001d8f28;
  local_180 = 0;
  AixLog::operator<<((ostream *)&local_190,(Timestamp *)pTVar11);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_268,"expand_loop",&local_27b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_268 + 0x28),
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
             ,&local_279);
  pFVar10 = (Function *)local_268;
  local_270 = func;
  AixLog::Function::Function
            ((Function *)local_178,(string *)pFVar10,(string *)(local_268 + 0x28),0x149);
  AixLog::operator<<((ostream *)local_178,pFVar10);
  pTVar3 = (Tag *)std::operator<<((ostream *)&std::clog,"init_val: ");
  local_e0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  local_e0.id = (info->init_var).first.id;
  local_50._8_4_ = (info->init_var).second;
  local_50._24_1_ = 0;
  local_50.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001dafa8;
  local_50.shift = Lsl;
  local_50.shift_amount = '\0';
  mir::inst::AssignInst::AssignInst((AssignInst *)local_1e8,&local_e0,&local_50);
  pTVar11 = pTVar3;
  (**(_func_int **)local_1e8._0_8_)();
  std::endl<char,std::char_traits<char>>((ostream *)pTVar3);
  AixLog::Function::~Function((Function *)local_178);
  std::__cxx11::string::~string((string *)(local_268 + 0x28));
  std::__cxx11::string::~string((string *)local_268);
  AixLog::Tag::~Tag((Tag *)local_218);
  local_27a = (allocator<char>)0x0;
  AixLog::operator<<((ostream *)&local_27a,(Severity *)pTVar11);
  AixLog::Tag::Tag((Tag *)local_218);
  AixLog::operator<<((ostream *)local_218,pTVar11);
  local_188 = std::chrono::_V2::system_clock::now();
  local_190 = &PTR__Timestamp_001d8f28;
  local_180 = 0;
  AixLog::operator<<((ostream *)&local_190,(Timestamp *)pTVar11);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_268,"expand_loop",&local_27b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_268 + 0x28),
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
             ,&local_279);
  pFVar10 = (Function *)local_268;
  AixLog::Function::Function
            ((Function *)local_1e8,(string *)pFVar10,(string *)(local_268 + 0x28),0x14c);
  AixLog::operator<<((ostream *)local_1e8,pFVar10);
  pTVar3 = (Tag *)std::operator<<((ostream *)&std::clog,"change : ");
  local_f0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  local_f0.id = (info->init_var).first.id;
  local_70._8_8_ = &PTR_display_001d90d0;
  local_58 = 1;
  local_70._0_8_ = &PTR_display_001dafa8;
  local_57._0_1_ = Lsl;
  local_57._1_1_ = '\0';
  local_90._8_4_ = info->change_value;
  local_90._24_1_ = 0;
  local_90.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001dafa8;
  local_90.shift = Lsl;
  local_90.shift_amount = '\0';
  local_60 = local_f0.id;
  mir::inst::OpInst::OpInst
            ((OpInst *)local_178,&local_f0,(Value *)local_70,&local_90,info->change_op);
  pTVar11 = pTVar3;
  (**(_func_int **)local_178._0_8_)();
  std::endl<char,std::char_traits<char>>((ostream *)pTVar3);
  AixLog::Function::~Function((Function *)local_1e8);
  std::__cxx11::string::~string((string *)(local_268 + 0x28));
  std::__cxx11::string::~string((string *)local_268);
  AixLog::Tag::~Tag((Tag *)local_218);
  local_27a = (allocator<char>)0x0;
  AixLog::operator<<((ostream *)&local_27a,(Severity *)pTVar11);
  AixLog::Tag::Tag((Tag *)local_218);
  AixLog::operator<<((ostream *)local_218,pTVar11);
  local_188 = std::chrono::_V2::system_clock::now();
  local_190 = &PTR__Timestamp_001d8f28;
  local_180 = 0;
  AixLog::operator<<((ostream *)&local_190,(Timestamp *)pTVar11);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_268,"expand_loop",&local_27b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_268 + 0x28),
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
             ,&local_279);
  pFVar10 = (Function *)local_268;
  AixLog::Function::Function
            ((Function *)local_1e8,(string *)pFVar10,(string *)(local_268 + 0x28),0x150);
  AixLog::operator<<((ostream *)local_1e8,pFVar10);
  poVar2 = std::operator<<((ostream *)&std::clog,"continue when: ");
  local_100.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  local_100.id = 0;
  local_a0 = (info->init_var).first.id;
  local_b0._8_8_ = &PTR_display_001d90d0;
  local_98 = 1;
  local_b0._0_8_ = &PTR_display_001dafa8;
  local_97._0_1_ = Lsl;
  local_97._1_1_ = '\0';
  local_d0._8_4_ = info->in_value;
  local_d0._24_1_ = 0;
  local_d0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001dafa8;
  local_d0.shift = Lsl;
  local_d0.shift_amount = '\0';
  mir::inst::OpInst::OpInst((OpInst *)local_178,&local_100,(Value *)local_b0,&local_d0,info->in_op);
  (**(_func_int **)local_178._0_8_)(local_178,poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  AixLog::Function::~Function((Function *)local_1e8);
  std::__cxx11::string::~string((string *)(local_268 + 0x28));
  std::__cxx11::string::~string((string *)local_268);
  AixLog::Tag::~Tag((Tag *)local_218);
  local_120 = (info->init_var).first.id;
  local_130 = (info->phi_var).id;
  local_110 = (info->change_var).id;
  local_160._M_left = &local_160;
  local_178._0_8_ = local_270;
  local_160._M_color = 0;
  local_160._M_parent = (_Base_ptr)0x0;
  local_140._0_8_ = 0;
  local_140._8_8_ = &PTR_display_001d90d0;
  local_128 = &PTR_display_001d90d0;
  local_118 = &PTR_display_001d90d0;
  local_178._8_8_ = blk;
  local_160._M_right = local_160._M_left;
  lVar4 = std::_Rb_tree_decrement
                    (&(local_270->variables)._M_t._M_impl.super__Rb_tree_header._M_header);
  local_108 = *(int *)(lVar4 + 0x20);
  local_1c0 = (blk->jump).bb_false;
  local_1e8._0_8_ = &PTR_display_001db418;
  local_1e8._8_4_ = 3;
  local_1e8[0x20] = '\0';
  local_1bc = 0xffffffff;
  mir::inst::JumpInstruction::operator=(&blk->jump,(JumpInstruction *)local_1e8);
  iVar1 = loop_info::get_times(info);
  local_268._0_8_ = &PTR_display_001d90d0;
  local_268._8_4_ = 0xffffffff;
  Rewriter::get_insts((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       *)local_218,(Rewriter *)local_178,iVar1,(VarId *)local_268);
  local_220 = &(info->init_var).first;
  local_270 = (MirFunction *)&info->change_var;
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::clear(&blk->inst);
  this = &local_278->inst;
  for (__args = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                local_218._0_8_; pmVar6 = local_278,
      __args != (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                local_218._8_8_; __args = __args + 1) {
    std::
    vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
    ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
              ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                *)this,__args);
  }
  __k = &(local_278->jump).bb_false;
  pmVar5 = std::
           map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
           ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                 *)local_268._32_8_,__k);
  __x = &(pmVar6->jump).bb_true;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
            (&(pmVar5->preceding)._M_t,__x);
  local_1c0 = *__k;
  local_1e8._0_8_ = &PTR_display_001db418;
  local_1e8._8_4_ = 3;
  local_1e8[0x20] = '\0';
  local_1bc = 0xffffffff;
  mir::inst::JumpInstruction::operator=(&pmVar6->jump,(JumpInstruction *)local_1e8);
  std::
  _Rb_tree<int,_std::pair<const_int,_mir::inst::BasicBlk>,_std::_Select1st<std::pair<const_int,_mir::inst::BasicBlk>_>,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  ::erase((_Rb_tree<int,_std::pair<const_int,_mir::inst::BasicBlk>,_std::_Select1st<std::pair<const_int,_mir::inst::BasicBlk>_>,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
           *)local_268._32_8_,&blk->id);
  local_278 = (mapped_type *)CONCAT44(local_278._4_4_,iVar1);
  pmVar6 = std::
           map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
           ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                 *)local_268._32_8_,__x);
  for (puVar9 = (pmVar6->inst).
                super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar9 != (pmVar6->inst).
                super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; puVar9 = puVar9 + 1) {
    iVar1 = (*(((puVar9->_M_t).
                super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable).
              _vptr_Displayable[1])();
    if (iVar1 != 7) break;
    this_00 = (PhiInst *)
              (puVar9->_M_t).
              super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
              super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
              super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
    if ((this_00->super_Inst).super_Displayable._vptr_Displayable !=
        (_func_int **)&PTR_display_001db3b8) {
      this_00 = (PhiInst *)0x0;
    }
    mir::inst::PhiInst::useVars
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)local_1e8,this_00);
    sVar7 = std::
            set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
            count((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                   *)local_1e8,(key_type *)local_270);
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                 *)local_1e8);
    if (sVar7 != 0) {
      _Var8 = std::
              __find_if<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_equals_val<mir::inst::VarId_const>>
                        (*(undefined8 *)
                          &(this_00->vars).
                           super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,
                         (this_00->vars).
                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                         _M_impl.super__Vector_impl_data._M_finish,local_270);
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::erase
                (&this_00->vars,(const_iterator)_Var8._M_current);
    }
    if ((int)local_278 != 0) {
      mir::inst::PhiInst::useVars
                ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)local_1e8,this_00);
      sVar7 = std::
              set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              ::count((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                       *)local_1e8,local_220);
      std::
      _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
      ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                   *)local_1e8);
      if (sVar7 != 0) {
        _Var8 = std::
                __find_if<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_equals_val<mir::inst::VarId_const>>
                          (*(undefined8 *)
                            &(this_00->vars).
                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                           ,(this_00->vars).
                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                            _M_impl.super__Vector_impl_data._M_finish,local_220);
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::erase
                  (&this_00->vars,(const_iterator)_Var8._M_current);
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                  (&this_00->vars,(value_type *)local_268);
      }
    }
  }
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             *)local_218);
  std::
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::_Select1st<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::_Select1st<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
               *)(local_178 + 0x10));
  return;
}

Assistant:

void expand_loop(mir::inst::MirFunction& func, mir::inst::BasicBlk& blk,
                 loop_info info) {
  auto& loop_start = func.basic_blks.at(info.loop_start);
  LOG(TRACE) << "expand loop starts at  " << info.loop_start << std::endl;
  LOG(TRACE) << "init_val: "
             << mir::inst::AssignInst(info.init_var.first, info.init_var.second)
             << std::endl;
  LOG(TRACE) << "change : "
             << mir::inst::OpInst(info.init_var.first, info.init_var.first,
                                  info.change_value, info.change_op)
             << std::endl;
  LOG(TRACE) << "continue when: "
             << mir::inst::OpInst(mir::inst::VarId(0), info.init_var.first,
                                  info.in_value, info.in_op)
             << std::endl;
  Rewriter rwt(func, blk, {info.phi_var, info.init_var.first}, info.change_var);
  blk.jump = mir::inst::JumpInstruction(mir::inst::JumpInstructionKind::Br,
                                        blk.jump.bb_false);
  int times = info.get_times();
  mir::inst::VarId new_change_var;
  auto insts = rwt.get_insts(times, new_change_var);
  blk.inst.clear();
  for (auto& inst : insts) {
    loop_start.inst.push_back(std::move(inst));
  }
  func.basic_blks.at(loop_start.jump.bb_false)
      .preceding.erase(loop_start.jump.bb_true);

  loop_start.jump = mir::inst::JumpInstruction(
      mir::inst::JumpInstructionKind::Br, loop_start.jump.bb_false);
  func.basic_blks.erase(blk.id);
  auto& end_loop_blk = func.basic_blks.at(loop_start.jump.bb_true);
  for (auto iter = end_loop_blk.inst.begin();
       iter != end_loop_blk.inst.end() &&
       iter->get()->inst_kind() == mir::inst::InstKind::Phi;
       iter++) {
    auto& inst = *iter;
    auto& i = *inst;
    auto phiInst = dynamic_cast<mir::inst::PhiInst*>(&i);
    if (phiInst->useVars().count(info.change_var)) {
      phiInst->vars.erase(std::find(phiInst->vars.begin(), phiInst->vars.end(),
                                    info.change_var));
    }
    if (times) {
      if (phiInst->useVars().count(info.init_var.first)) {
        phiInst->vars.erase(std::find(
            phiInst->vars.begin(), phiInst->vars.end(), info.init_var.first));
        phiInst->vars.push_back(new_change_var);
      }
    }
  }
}